

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpRepeatedVarint<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  FieldEntry *pFVar2;
  char *pcVar3;
  Nullable<const_char_*> failure_msg;
  ushort uVar4;
  ushort local_42;
  LogMessageFatal local_40;
  
  pFVar2 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                     (table,(ulong)data.field_0 >> 0x20);
  if (((ulong)data.field_0 & 7) != 0) {
    if ((data.field_0._0_4_ & 7) == 2) {
      pcVar3 = MpPackedVarint<false>(msg,ptr,ctx,data,table,hasbits);
      return pcVar3;
    }
    pcVar3 = (*table->fallback)(msg,ptr,ctx,(TcFieldData)data.field_0,table,hasbits);
    return pcVar3;
  }
  uVar1 = pFVar2->type_card >> 6;
  uVar4 = uVar1 & 7;
  if ((uVar1 & 7) == 0) {
    pcVar3 = MpRepeatedVarintT<false,bool,(unsigned_short)0>(msg,ptr,ctx,data,table,hasbits);
    return pcVar3;
  }
  local_42 = pFVar2->type_card & 0x600;
  if (uVar4 != 2) {
    if (uVar4 != 3) {
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x898);
    }
    if (local_42 != 0) {
      local_40.super_LogMessage.errno_saver_.saved_errno_ = 0x200;
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,int>
                              (&local_42,(int *)&local_40,"xform_val == +field_layout::kTvZigZag");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        pcVar3 = MpRepeatedVarintT<false,unsigned_long,(unsigned_short)512>
                           (msg,ptr,ctx,data,table,hasbits);
        return pcVar3;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x87a,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
    pcVar3 = MpRepeatedVarintT<false,unsigned_long,(unsigned_short)0>
                       (msg,ptr,ctx,data,table,hasbits);
    return pcVar3;
  }
  switch(local_42) {
  default:
    pcVar3 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)0>(msg,ptr,ctx,data,table,hasbits)
    ;
    return pcVar3;
  case 0x200:
  case 0x220:
  case 0x240:
  case 0x260:
  case 0x280:
  case 0x2a0:
  case 0x2c0:
  case 0x2e0:
  case 0x300:
  case 800:
  case 0x340:
  case 0x360:
  case 0x380:
  case 0x3a0:
  case 0x3c0:
  case 0x3e0:
    pcVar3 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)512>
                       (msg,ptr,ctx,data,table,hasbits);
    return pcVar3;
  case 0x400:
  case 0x420:
  case 0x440:
  case 0x460:
  case 0x480:
  case 0x4a0:
  case 0x4c0:
  case 0x4e0:
  case 0x500:
  case 0x520:
  case 0x540:
  case 0x560:
  case 0x580:
  case 0x5a0:
  case 0x5c0:
  case 0x5e0:
    pcVar3 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1024>
                       (msg,ptr,ctx,data,table,hasbits);
    return pcVar3;
  case 0x600:
  case 0x620:
  case 0x640:
  case 0x660:
  case 0x680:
  case 0x6a0:
  case 0x6c0:
  case 0x6e0:
  case 0x700:
  case 0x720:
  case 0x740:
  case 0x760:
  case 0x780:
  case 0x7a0:
  case 0x7c0:
  case 0x7e0:
    pcVar3 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1536>
                       (msg,ptr,ctx,data,table,hasbits);
    return pcVar3;
  }
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedVarint(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const auto type_card = entry.type_card;
  const uint32_t decoded_tag = data.tag();
  const auto decoded_wiretype = decoded_tag & 7;

  // Check for packed repeated fallback:
  if (decoded_wiretype == WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return MpPackedVarint<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  // Check for wire type mismatch:
  if (decoded_wiretype != WireFormatLite::WIRETYPE_VARINT) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }
  // For split we avoid the duplicate code and have the impl reload the value.
  // Less code bloat for uncommon paths.
  const uint16_t xform_val = (type_card & field_layout::kTvMask);
  const uint16_t rep = type_card & field_layout::kRepMask;
  switch (rep >> field_layout::kRepShift) {
    case field_layout::kRep64Bits >> field_layout::kRepShift:
      if (xform_val == 0) {
        PROTOBUF_MUSTTAIL return MpRepeatedVarintT<is_split, uint64_t, 0>(
            PROTOBUF_TC_PARAM_PASS);
      } else {
        ABSL_DCHECK_EQ(xform_val, +field_layout::kTvZigZag);
        PROTOBUF_MUSTTAIL return MpRepeatedVarintT<
            is_split, uint64_t, (is_split ? 0 : field_layout::kTvZigZag)>(
            PROTOBUF_TC_PARAM_PASS);
      }
    case field_layout::kRep32Bits >> field_layout::kRepShift:
      switch (xform_val >> field_layout::kTvShift) {
        case 0:
          PROTOBUF_MUSTTAIL return MpRepeatedVarintT<is_split, uint32_t, 0>(
              PROTOBUF_TC_PARAM_PASS);
        case field_layout::kTvZigZag >> field_layout::kTvShift:
          PROTOBUF_MUSTTAIL return MpRepeatedVarintT<
              is_split, uint32_t, (is_split ? 0 : field_layout::kTvZigZag)>(
              PROTOBUF_TC_PARAM_PASS);
        case field_layout::kTvEnum >> field_layout::kTvShift:
          PROTOBUF_MUSTTAIL return MpRepeatedVarintT<
              is_split, uint32_t, (is_split ? 0 : field_layout::kTvEnum)>(
              PROTOBUF_TC_PARAM_PASS);
        case field_layout::kTvRange >> field_layout::kTvShift:
          PROTOBUF_MUSTTAIL return MpRepeatedVarintT<
              is_split, uint32_t, (is_split ? 0 : field_layout::kTvRange)>(
              PROTOBUF_TC_PARAM_PASS);
        default:
          Unreachable();
      }
    case field_layout::kRep8Bits >> field_layout::kRepShift:
      PROTOBUF_MUSTTAIL return MpRepeatedVarintT<is_split, bool, 0>(
          PROTOBUF_TC_PARAM_PASS);

    default:
      Unreachable();
      return nullptr;  // To silence -Werror=return-type in some toolchains
  }
}